

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

Symbol __thiscall
google::protobuf::DescriptorPool::NewPlaceholderWithMutexHeld
          (DescriptorPool *this,StringPiece name,PlaceholderType placeholder_type)

{
  StringPiece str;
  bool bVar1;
  char cVar2;
  pointer pTVar3;
  FileDescriptor *pFVar4;
  EnumDescriptor *pEVar5;
  string *psVar6;
  EnumOptions *pEVar7;
  EnumValueDescriptor *pEVar8;
  ulong uVar9;
  EnumValueOptions *pEVar10;
  Descriptor *pDVar11;
  MessageOptions *pMVar12;
  ExtensionRange *pEVar13;
  undefined4 in_register_0000000c;
  AlphaNum *b;
  size_type extraout_RDX;
  StringPiece name_00;
  Descriptor *placeholder_message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  void *local_168;
  EnumValueDescriptor *placeholder_value;
  EnumDescriptor *placeholder_enum;
  AlphaNum local_148;
  size_type local_118;
  char *pcStack_110;
  AlphaNum local_108;
  string local_d8;
  StringPiece local_b8;
  FileDescriptor *local_a8;
  FileDescriptor *placeholder_file;
  char *local_98;
  StringPiece local_90;
  size_type local_80;
  size_type dotpos;
  char *local_70;
  DescriptorPool *local_68;
  char *local_60;
  string *local_58;
  string *placeholder_package;
  StringPiece placeholder_name;
  StringPiece placeholder_full_name;
  PlaceholderType placeholder_type_local;
  DescriptorPool *this_local;
  StringPiece name_local;
  
  b = (AlphaNum *)CONCAT44(in_register_0000000c,placeholder_type);
  name_local.ptr_ = (char *)name.length_;
  this_local = (DescriptorPool *)name.ptr_;
  if (this->mutex_ != (WrappedMutex *)0x0) {
    internal::WrappedMutex::AssertHeld(this->mutex_);
  }
  stringpiece_internal::StringPiece::StringPiece((StringPiece *)&placeholder_name.length_);
  stringpiece_internal::StringPiece::StringPiece((StringPiece *)&placeholder_package);
  local_68 = this_local;
  local_60 = name_local.ptr_;
  name_00.length_ = extraout_RDX;
  name_00.ptr_ = name_local.ptr_;
  bVar1 = ValidateQualifiedName((protobuf *)this_local,name_00);
  if (bVar1) {
    cVar2 = stringpiece_internal::StringPiece::operator[]((StringPiece *)&this_local,0);
    if (cVar2 == '.') {
      _dotpos = stringpiece_internal::StringPiece::substr
                          ((StringPiece *)&this_local,1,0xffffffffffffffff);
      placeholder_name.length_ = dotpos;
      placeholder_full_name.ptr_ = local_70;
    }
    else {
      placeholder_name.length_ = (size_type)this_local;
      placeholder_full_name.ptr_ = name_local.ptr_;
    }
    local_80 = stringpiece_internal::StringPiece::find_last_of
                         ((StringPiece *)&placeholder_name.length_,'.',0xffffffffffffffff);
    if (local_80 == 0xffffffffffffffff) {
      local_58 = internal::GetEmptyString_abi_cxx11_();
      placeholder_package = (string *)placeholder_name.length_;
      placeholder_name.ptr_ = placeholder_full_name.ptr_;
    }
    else {
      pTVar3 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      local_90 = stringpiece_internal::StringPiece::substr
                           ((StringPiece *)&placeholder_name.length_,0,local_80);
      local_58 = Tables::AllocateString_abi_cxx11_(pTVar3,local_90);
      _placeholder_file =
           stringpiece_internal::StringPiece::substr
                     ((StringPiece *)&placeholder_name.length_,local_80 + 1,0xffffffffffffffff);
      placeholder_package = (string *)placeholder_file;
      placeholder_name.ptr_ = local_98;
    }
    local_118 = placeholder_name.length_;
    pcStack_110 = placeholder_full_name.ptr_;
    str.length_ = (size_type)placeholder_full_name.ptr_;
    str.ptr_ = (char *)placeholder_name.length_;
    strings::AlphaNum::AlphaNum(&local_108,str);
    strings::AlphaNum::AlphaNum(&local_148,".placeholder.proto");
    StrCat_abi_cxx11_(&local_d8,(protobuf *)&local_108,&local_148,b);
    stringpiece_internal::StringPiece::StringPiece<std::allocator<char>>(&local_b8,&local_d8);
    pFVar4 = NewPlaceholderFileWithMutexHeld(this,local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    *(string **)(pFVar4 + 8) = local_58;
    local_a8 = pFVar4;
    if (placeholder_type == PLACEHOLDER_ENUM) {
      *(undefined4 *)(pFVar4 + 0x30) = 1;
      pTVar3 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      pEVar5 = Tables::AllocateArray<google::protobuf::EnumDescriptor>(pTVar3,1);
      *(EnumDescriptor **)(local_a8 + 0x60) = pEVar5;
      placeholder_value = *(EnumValueDescriptor **)(local_a8 + 0x60);
      memset(placeholder_value,0,0x48);
      pTVar3 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      psVar6 = Tables::
               AllocateStringArray<google::protobuf::stringpiece_internal::StringPiece&,google::protobuf::stringpiece_internal::StringPiece&>
                         (pTVar3,(StringPiece *)&placeholder_package,
                          (StringPiece *)&placeholder_name.length_);
      *(string **)(placeholder_value + 8) = psVar6;
      *(FileDescriptor **)(placeholder_value + 0x10) = local_a8;
      pEVar7 = EnumOptions::default_instance();
      *(EnumOptions **)(placeholder_value + 0x20) = pEVar7;
      placeholder_value[1] = (EnumValueDescriptor)((byte)placeholder_value[1] & 0xfe | 1);
      cVar2 = stringpiece_internal::StringPiece::operator[]((StringPiece *)&this_local,0);
      placeholder_value[1] =
           (EnumValueDescriptor)((byte)placeholder_value[1] & 0xfd | (cVar2 != '.') << 1);
      *(undefined4 *)(placeholder_value + 4) = 1;
      pTVar3 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      pEVar8 = Tables::AllocateArray<google::protobuf::EnumValueDescriptor>(pTVar3,1);
      *(EnumValueDescriptor **)(placeholder_value + 0x28) = pEVar8;
      *(undefined2 *)(placeholder_value + 2) = 0xffff;
      local_168 = *(void **)(placeholder_value + 0x28);
      memset(local_168,0,0x20);
      pTVar3 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      uVar9 = std::__cxx11::string::empty();
      placeholder_message._6_1_ = 0;
      if ((uVar9 & 1) == 0) {
        std::operator+(&local_188,local_58,".PLACEHOLDER_VALUE");
      }
      else {
        std::allocator<char>::allocator();
        placeholder_message._6_1_ = 1;
        std::__cxx11::string::string
                  ((string *)&local_188,"PLACEHOLDER_VALUE",
                   (allocator *)((long)&placeholder_message + 7));
      }
      psVar6 = Tables::AllocateStringArray<char_const(&)[18],std::__cxx11::string>
                         (pTVar3,(char (*) [18])0x7c90be,&local_188);
      *(string **)((long)local_168 + 8) = psVar6;
      std::__cxx11::string::~string((string *)&local_188);
      if ((placeholder_message._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&placeholder_message + 7));
      }
      *(undefined4 *)((long)local_168 + 4) = 0;
      *(EnumValueDescriptor **)((long)local_168 + 0x10) = placeholder_value;
      pEVar10 = EnumValueOptions::default_instance();
      *(EnumValueOptions **)((long)local_168 + 0x18) = pEVar10;
      Symbol::Symbol((Symbol *)&name_local.length_,(EnumDescriptor *)placeholder_value);
    }
    else {
      *(undefined4 *)(pFVar4 + 0x2c) = 1;
      pTVar3 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      pDVar11 = Tables::AllocateArray<google::protobuf::Descriptor>(pTVar3,1);
      *(Descriptor **)(local_a8 + 0x58) = pDVar11;
      pDVar11 = *(Descriptor **)(local_a8 + 0x58);
      memset(pDVar11,0,0x88);
      pTVar3 = std::
               unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
               ::operator->(&this->tables_);
      psVar6 = Tables::
               AllocateStringArray<google::protobuf::stringpiece_internal::StringPiece&,google::protobuf::stringpiece_internal::StringPiece&>
                         (pTVar3,(StringPiece *)&placeholder_package,
                          (StringPiece *)&placeholder_name.length_);
      *(string **)(pDVar11 + 8) = psVar6;
      *(FileDescriptor **)(pDVar11 + 0x10) = local_a8;
      pMVar12 = MessageOptions::default_instance();
      *(MessageOptions **)(pDVar11 + 0x20) = pMVar12;
      pDVar11[1] = (Descriptor)((byte)pDVar11[1] & 0xfe | 1);
      cVar2 = stringpiece_internal::StringPiece::operator[]((StringPiece *)&this_local,0);
      pDVar11[1] = (Descriptor)((byte)pDVar11[1] & 0xfd | (cVar2 != '.') << 1);
      if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
        *(undefined4 *)(pDVar11 + 0x78) = 1;
        pTVar3 = std::
                 unique_ptr<google::protobuf::DescriptorPool::Tables,_std::default_delete<google::protobuf::DescriptorPool::Tables>_>
                 ::operator->(&this->tables_);
        pEVar13 = Tables::AllocateArray<google::protobuf::Descriptor::ExtensionRange>(pTVar3,1);
        *(ExtensionRange **)(pDVar11 + 0x48) = pEVar13;
        **(undefined4 **)(pDVar11 + 0x48) = 1;
        *(undefined4 *)(*(long *)(pDVar11 + 0x48) + 4) = 0x20000000;
        *(undefined8 *)(*(long *)(pDVar11 + 0x48) + 8) = 0;
      }
      Symbol::Symbol((Symbol *)&name_local.length_,pDVar11);
    }
  }
  else {
    name_local.length_ = (anonymous_namespace)::kNullSymbol;
  }
  return (Symbol)(SymbolBase *)name_local.length_;
}

Assistant:

Symbol DescriptorPool::NewPlaceholderWithMutexHeld(
    StringPiece name, PlaceholderType placeholder_type) const {
  if (mutex_) {
    mutex_->AssertHeld();
  }
  // Compute names.
  StringPiece placeholder_full_name;
  StringPiece placeholder_name;
  const std::string* placeholder_package;

  if (!ValidateQualifiedName(name)) return kNullSymbol;
  if (name[0] == '.') {
    // Fully-qualified.
    placeholder_full_name = name.substr(1);
  } else {
    placeholder_full_name = name;
  }

  std::string::size_type dotpos = placeholder_full_name.find_last_of('.');
  if (dotpos != std::string::npos) {
    placeholder_package =
        tables_->AllocateString(placeholder_full_name.substr(0, dotpos));
    placeholder_name = placeholder_full_name.substr(dotpos + 1);
  } else {
    placeholder_package = &internal::GetEmptyString();
    placeholder_name = placeholder_full_name;
  }

  // Create the placeholders.
  FileDescriptor* placeholder_file = NewPlaceholderFileWithMutexHeld(
      StrCat(placeholder_full_name, ".placeholder.proto"));
  placeholder_file->package_ = placeholder_package;

  if (placeholder_type == PLACEHOLDER_ENUM) {
    placeholder_file->enum_type_count_ = 1;
    placeholder_file->enum_types_ = tables_->AllocateArray<EnumDescriptor>(1);

    EnumDescriptor* placeholder_enum = &placeholder_file->enum_types_[0];
    memset(static_cast<void*>(placeholder_enum), 0, sizeof(*placeholder_enum));

    placeholder_enum->all_names_ =
        tables_->AllocateStringArray(placeholder_name, placeholder_full_name);
    placeholder_enum->file_ = placeholder_file;
    placeholder_enum->options_ = &EnumOptions::default_instance();
    placeholder_enum->is_placeholder_ = true;
    placeholder_enum->is_unqualified_placeholder_ = (name[0] != '.');

    // Enums must have at least one value.
    placeholder_enum->value_count_ = 1;
    placeholder_enum->values_ = tables_->AllocateArray<EnumValueDescriptor>(1);
    // Disable fast-path lookup for this enum.
    placeholder_enum->sequential_value_limit_ = -1;

    EnumValueDescriptor* placeholder_value = &placeholder_enum->values_[0];
    memset(static_cast<void*>(placeholder_value), 0,
           sizeof(*placeholder_value));

    // Note that enum value names are siblings of their type, not children.
    placeholder_value->all_names_ = tables_->AllocateStringArray(
        "PLACEHOLDER_VALUE", placeholder_package->empty()
                                 ? "PLACEHOLDER_VALUE"
                                 : *placeholder_package + ".PLACEHOLDER_VALUE");

    placeholder_value->number_ = 0;
    placeholder_value->type_ = placeholder_enum;
    placeholder_value->options_ = &EnumValueOptions::default_instance();

    return Symbol(placeholder_enum);
  } else {
    placeholder_file->message_type_count_ = 1;
    placeholder_file->message_types_ = tables_->AllocateArray<Descriptor>(1);

    Descriptor* placeholder_message = &placeholder_file->message_types_[0];
    memset(static_cast<void*>(placeholder_message), 0,
           sizeof(*placeholder_message));

    placeholder_message->all_names_ =
        tables_->AllocateStringArray(placeholder_name, placeholder_full_name);
    placeholder_message->file_ = placeholder_file;
    placeholder_message->options_ = &MessageOptions::default_instance();
    placeholder_message->is_placeholder_ = true;
    placeholder_message->is_unqualified_placeholder_ = (name[0] != '.');

    if (placeholder_type == PLACEHOLDER_EXTENDABLE_MESSAGE) {
      placeholder_message->extension_range_count_ = 1;
      placeholder_message->extension_ranges_ =
          tables_->AllocateArray<Descriptor::ExtensionRange>(1);
      placeholder_message->extension_ranges_->start = 1;
      // kMaxNumber + 1 because ExtensionRange::end is exclusive.
      placeholder_message->extension_ranges_->end =
          FieldDescriptor::kMaxNumber + 1;
      placeholder_message->extension_ranges_->options_ = nullptr;
    }

    return Symbol(placeholder_message);
  }
}